

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraphBuilder.h
# Opt level: O0

unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> * __thiscall
dg::llvmdg::LLVMDependenceGraphBuilder::constructCFGOnly(LLVMDependenceGraphBuilder *this)

{
  LLVMPointerAnalysis *pLVar1;
  pointer this_00;
  LLVMDataDependenceAnalysis *pLVar2;
  pointer pLVar3;
  pointer pCVar4;
  ulong uVar5;
  undefined8 *in_RDI;
  pointer in_stack_ffffffffffffffc8;
  LLVMDependenceGraphBuilder *in_stack_ffffffffffffffd0;
  unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *local_8;
  
  _runPointerAnalysis(in_stack_ffffffffffffffd0);
  this_00 = std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
            ::operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                          *)0x1bd089);
  pLVar1 = (LLVMPointerAnalysis *)*in_RDI;
  pLVar2 = (LLVMDataDependenceAnalysis *)
           std::unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_>::
           get((unique_ptr<dg::LLVMPointerAnalysis,_std::default_delete<dg::LLVMPointerAnalysis>_> *
               )0x1bd0a7);
  pLVar3 = std::
           unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
           ::get((unique_ptr<dg::dda::LLVMDataDependenceAnalysis,_std::default_delete<dg::dda::LLVMDataDependenceAnalysis>_>
                  *)0x1bd0bd);
  dg::LLVMDependenceGraph::build((Module *)this_00,pLVar1,pLVar2,(Function *)pLVar3);
  if ((*(byte *)((long)in_RDI + 0x179) & 1) != 0) {
    pCVar4 = std::unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_>::operator->
                       ((unique_ptr<ControlFlowGraph,_std::default_delete<ControlFlowGraph>_> *)
                        0x1bd0ff);
    ControlFlowGraph::buildFunction((Function *)pCVar4);
  }
  if ((*(byte *)(in_RDI + 0x2f) & 1) != 0) {
    std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::
    operator->((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *
               )0x1bd132);
    uVar5 = dg::LLVMDependenceGraph::verify();
    if ((uVar5 & 1) == 0) {
      std::unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>::reset
                ((unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_>
                  *)this_00,in_stack_ffffffffffffffc8);
    }
  }
  local_8 = (unique_ptr<dg::LLVMDependenceGraph,_std::default_delete<dg::LLVMDependenceGraph>_> *)
            (in_RDI + 0x37);
  return local_8;
}

Assistant:

std::unique_ptr<LLVMDependenceGraph> &&constructCFGOnly() {
        // data dependencies
        _runPointerAnalysis();

        // build the graph itself
        _dg->build(_M, _PTA.get(), _DDA.get(), _entryFunction);

        if (_options.threads) {
            _controlFlowGraph->buildFunction(_entryFunction);
        }

        // verify if the graph is built correctly
        if (_options.verifyGraph && !_dg->verify()) {
            _dg.reset();
            return std::move(_dg);
        }

        return std::move(_dg);
    }